

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O1

BlockGraph * __thiscall GraphBuilder::findBlock(GraphBuilder *this,BasicBlock *basicBlock)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  ulong uVar3;
  __node_base_ptr p_Var4;
  __node_base_ptr p_Var5;
  
  if (basicBlock != (BasicBlock *)0x0) {
    uVar1 = (this->llvmToBlockMap_)._M_h._M_bucket_count;
    uVar3 = (ulong)basicBlock % uVar1;
    p_Var4 = (this->llvmToBlockMap_)._M_h._M_buckets[uVar3];
    p_Var5 = (__node_base_ptr)0x0;
    if ((p_Var4 != (__node_base_ptr)0x0) &&
       (p_Var2 = p_Var4->_M_nxt, p_Var5 = p_Var4,
       (BasicBlock *)p_Var4->_M_nxt[1]._M_nxt != basicBlock)) {
      while (p_Var4 = p_Var2, p_Var2 = p_Var4->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
        p_Var5 = (__node_base_ptr)0x0;
        if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar3) ||
           (p_Var5 = p_Var4, (BasicBlock *)p_Var2[1]._M_nxt == basicBlock)) goto LAB_0011966c;
      }
      p_Var5 = (__node_base_ptr)0x0;
    }
LAB_0011966c:
    if (p_Var5 == (__node_base_ptr)0x0) {
      p_Var2 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var2 = p_Var5->_M_nxt;
    }
    if (p_Var2 != (_Hash_node_base *)0x0) {
      return (BlockGraph *)p_Var2[2]._M_nxt;
    }
  }
  return (BlockGraph *)0x0;
}

Assistant:

BlockGraph *GraphBuilder::findBlock(const llvm::BasicBlock *basicBlock) {
    if (!basicBlock) {
        return nullptr;
    }
    auto iterator = this->llvmToBlockMap_.find(basicBlock);
    if (iterator == this->llvmToBlockMap_.end()) {
        return nullptr;
    }
    return iterator->second;
}